

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_modinfo.hpp
# Opt level: O2

void __thiscall
ELFIO::modinfo_section_accessor_template<const_ELFIO::section>::process_section
          (modinfo_section_accessor_template<const_ELFIO::section> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar3;
  string info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar2;
  
  iVar1 = (*this->modinfo_section->_vptr_section[0x18])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    uVar3 = 0;
    while( true ) {
      iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
      if (CONCAT44(extraout_var_00,iVar1) <= uVar3) break;
      while( true ) {
        iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
        if ((CONCAT44(extraout_var_01,iVar1) <= uVar3) || (*(char *)(lVar2 + uVar3) != '\0')) break;
        uVar3 = uVar3 + 1;
      }
      iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
      if (uVar3 < CONCAT44(extraout_var_02,iVar1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&info,(char *)(lVar2 + uVar3),(allocator<char> *)&local_70);
        std::__cxx11::string::find((char)&info,0x3d);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&info);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&info);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&this->content,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        uVar3 = uVar3 + info._M_string_length;
        std::__cxx11::string::~string((string *)&info);
      }
    }
  }
  return;
}

Assistant:

void process_section()
    {
        const char* pdata = modinfo_section->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i = 0;
            while ( i < modinfo_section->get_size() ) {
                while ( i < modinfo_section->get_size() && !pdata[i] )
                    i++;
                if ( i < modinfo_section->get_size() ) {
                    std::string info = pdata + i;
                    size_t      loc  = info.find( '=' );
                    content.emplace_back( info.substr( 0, loc ),
                                          info.substr( loc + 1 ) );

                    i += info.length();
                }
            }
        }
    }